

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O2

RTIMU * RTIMU::createIMU(RTIMUSettings *settings)

{
  undefined1 *imuType;
  bool bVar1;
  RTIMULSM9DS1 *this;
  RTIMUMPU9250 *this_00;
  RTIMULSM9DS0 *this_01;
  RTIMUGD20M303DLHC *this_02;
  RTIMUBNO055 *this_03;
  RTIMUGD20HM303D *this_04;
  RTIMUNull *pRVar2;
  RTIMUMPU9150 *this_05;
  RTIMUGD20HM303DLHC *this_06;
  RTIMUBMX055 *this_07;
  
  imuType = &(settings->super_RTIMUHal).field_0x1c;
LAB_00115637:
  switch(*(undefined4 *)imuType) {
  case 0:
    break;
  case 1:
    pRVar2 = (RTIMUNull *)operator_new(0x108);
    RTIMUNull::RTIMUNull(pRVar2,settings);
    return &pRVar2->super_RTIMU;
  case 2:
    this_05 = (RTIMUMPU9150 *)operator_new(0xe38);
    RTIMUMPU9150::RTIMUMPU9150(this_05,settings);
    return &this_05->super_RTIMU;
  case 3:
    this_04 = (RTIMUGD20HM303D *)operator_new(0x110);
    RTIMUGD20HM303D::RTIMUGD20HM303D(this_04,settings);
    return &this_04->super_RTIMU;
  case 4:
    this_02 = (RTIMUGD20M303DLHC *)operator_new(0x118);
    RTIMUGD20M303DLHC::RTIMUGD20M303DLHC(this_02,settings);
    return &this_02->super_RTIMU;
  case 5:
    this_01 = (RTIMULSM9DS0 *)operator_new(0x110);
    RTIMULSM9DS0::RTIMULSM9DS0(this_01,settings);
    return &this_01->super_RTIMU;
  case 6:
    this = (RTIMULSM9DS1 *)operator_new(0x110);
    RTIMULSM9DS1::RTIMULSM9DS1(this,settings);
    return &this->super_RTIMU;
  case 7:
    this_00 = (RTIMUMPU9250 *)operator_new(0xe30);
    RTIMUMPU9250::RTIMUMPU9250(this_00,settings);
    return &this_00->super_RTIMU;
  case 8:
    this_06 = (RTIMUGD20HM303DLHC *)operator_new(0x118);
    RTIMUGD20HM303DLHC::RTIMUGD20HM303DLHC(this_06,settings);
    return &this_06->super_RTIMU;
  case 9:
    this_07 = (RTIMUBMX055 *)operator_new(0x120);
    RTIMUBMX055::RTIMUBMX055(this_07,settings);
    return &this_07->super_RTIMU;
  case 10:
    this_03 = (RTIMUBNO055 *)operator_new(0x110);
    RTIMUBNO055::RTIMUBNO055(this_03,settings);
    return &this_03->super_RTIMU;
  default:
    return (RTIMU *)0x0;
  }
  bVar1 = RTIMUSettings::discoverIMU
                    (settings,(int *)imuType,&(settings->super_RTIMUHal).m_busIsI2C,
                     &settings->m_I2CSlaveAddress);
  if (!bVar1) {
    pRVar2 = (RTIMUNull *)operator_new(0x108);
    RTIMUNull::RTIMUNull(pRVar2,settings);
    return &pRVar2->super_RTIMU;
  }
  (*(settings->super_RTIMUHal)._vptr_RTIMUHal[3])(settings);
  goto LAB_00115637;
}

Assistant:

RTIMU *RTIMU::createIMU(RTIMUSettings *settings)
{
    switch (settings->m_imuType) {
    case RTIMU_TYPE_MPU9150:
        return new RTIMUMPU9150(settings);

    case RTIMU_TYPE_GD20HM303D:
        return new RTIMUGD20HM303D(settings);

    case RTIMU_TYPE_GD20M303DLHC:
        return new RTIMUGD20M303DLHC(settings);

    case RTIMU_TYPE_LSM9DS0:
        return new RTIMULSM9DS0(settings);
    case RTIMU_TYPE_LSM9DS1:
        return new RTIMULSM9DS1(settings);

    case RTIMU_TYPE_MPU9250:
        return new RTIMUMPU9250(settings);

    case RTIMU_TYPE_GD20HM303DLHC:
        return new RTIMUGD20HM303DLHC(settings);

    case RTIMU_TYPE_BMX055:
        return new RTIMUBMX055(settings);

    case RTIMU_TYPE_BNO055:
        return new RTIMUBNO055(settings);

    case RTIMU_TYPE_AUTODISCOVER:
        if (settings->discoverIMU(settings->m_imuType, settings->m_busIsI2C, settings->m_I2CSlaveAddress)) {
            settings->saveSettings();
            return RTIMU::createIMU(settings);
        }
        return new RTIMUNull(settings);

    case RTIMU_TYPE_NULL:
        return new RTIMUNull(settings);

    default:
        return NULL;
    }
}